

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_MinipointCounterTest_SevenPairs_TestShell::createTest
          (TEST_MinipointCounterTest_SevenPairs_TestShell *this)

{
  TEST_MinipointCounterTest_SevenPairs_Test *this_00;
  
  this_00 = (TEST_MinipointCounterTest_SevenPairs_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                         ,0x7b);
  TEST_MinipointCounterTest_SevenPairs_Test::TEST_MinipointCounterTest_SevenPairs_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, SevenPairs)
{
	addPair(Tile::EastWind);
	addPair(Tile::NorthWind);
	addPair(Tile::ThreeOfCharacters);
	addPair(Tile::NineOfCircles);
	addPair(Tile::OneOfBamboos);
	addPair(Tile::GreenDragon);
	addPair(Tile::OneOfCharacters);
	s.selfDrawn();

	CHECK_EQUAL(25, m.total(false));
	CHECK_EQUAL(25, m.total());
}